

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

string * __thiscall
VectorInstance::op_replaceAll_with
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  string *value;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  pointer psVar7;
  string *type;
  shared_ptr<Instance> instance;
  shared_ptr<Instance> temporary;
  undefined1 local_68 [24];
  undefined1 local_50 [32];
  
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == 0x40) {
    value = &this->_element_type;
    local_68._16_8_ = __return_storage_ptr__;
    get_shared_instance((string *)(local_68 + 0x18),value);
    type = (string *)(local_50 + 0x10);
    get_shared_instance(type,value);
    psVar7 = (this->_value).
             super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->_value).
                                super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7) >> 4)) {
      lVar5 = 0;
      lVar6 = 0;
      do {
        bVar3 = InstanceIsEqualToComparator::operator()
                          ((InstanceIsEqualToComparator *)type,
                           (shared_ptr<Instance> *)
                           ((long)&(psVar7->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + lVar5),(shared_ptr<Instance> *)(local_68 + 0x18));
        if (bVar3) {
          get_shared_instance((string *)local_68,value);
          uVar2 = local_68._8_8_;
          uVar1 = local_68._0_8_;
          psVar7 = (this->_value).
                   super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_68._0_8_ = (pointer)0x0;
          local_68._8_8_ = (string *)0x0;
          this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)&(psVar7->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>).
                             _M_refcount._M_pi + lVar5);
          puVar4 = (undefined8 *)
                   ((long)&(psVar7->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                   + lVar5);
          *puVar4 = uVar1;
          puVar4[1] = uVar2;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          type = (string *)local_68._8_8_;
          if ((string *)local_68._8_8_ != (string *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
          }
        }
        lVar6 = lVar6 + 1;
        psVar7 = (this->_value).
                 super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 0x10;
      } while (lVar6 < (int)((ulong)((long)(this->_value).
                                           super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7
                                    ) >> 4));
    }
    uVar1 = local_68._16_8_;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)local_68._16_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_68._16_8_ + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68._16_8_,"null","");
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._24_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
    }
    return (string *)uVar1;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "RuntimeError: wrong number of arguments.";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

std::string VectorInstance::op_replaceAll_with(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    std::shared_ptr<Instance> temporary = get_shared_instance(_element_type, arguments[1]);
    for (int i = 0; i < int(_value.size()); i++)
        if (InstanceIsEqualToComparator()(_value[i], instance))
            _value[i] = get_shared_instance(_element_type, arguments[1]);
    return "null";
}